

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|=(CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  Range<wchar_t> local_40;
  CharClass<wchar_t> local_30;
  
  local_40._vptr_Range = (_func_int **)&PTR__Range_001b2a08;
  local_40.m_start = r->m_start;
  local_40.m_end = r->m_end;
  operator|(&local_30,this,&local_40);
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
  _M_move_assign(&this->m_ranges,&local_30.m_ranges);
  ~CharClass(&local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }